

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::PreciousBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  int iVar1;
  ChainstateManager *pCVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long in_FS_OFFSET;
  bool bVar5;
  shared_ptr<const_CBlock> pblock;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  CBlockIndex *local_38;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0xe16,false);
  bVar3 = ::operator<(&(pindex->nChainWork).super_base_uint<256U>,
                      &((this->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>);
  if (bVar3) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    bVar3 = true;
  }
  else {
    bVar3 = operator>(&((this->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>,
                      &(this->m_chainman->nLastPreciousChainwork).super_base_uint<256U>);
    pCVar2 = this->m_chainman;
    if (bVar3) {
      pCVar2->nBlockReverseSequenceId = -1;
    }
    base_uint<256U>::operator=
              (&(pCVar2->nLastPreciousChainwork).super_base_uint<256U>,
               &((this->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>);
    std::
    _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
    ::erase(&(this->setBlockIndexCandidates)._M_t,&local_38);
    pCVar2 = this->m_chainman;
    iVar1 = pCVar2->nBlockReverseSequenceId;
    local_38->nSequenceId = iVar1;
    pCVar2->nBlockReverseSequenceId = iVar1 + -1;
    bVar5 = (local_38->nStatus & 0x60) != 0;
    bVar3 = (local_38->nStatus & 7) < 3;
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(bVar3 || bVar5);
    if ((!bVar3 && !bVar5) && (local_38->m_chain_tx_count != 0)) {
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                  *)&this->setBlockIndexCandidates,&local_38);
      PruneBlockIndexCandidates(this);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    local_48._0_4_ = 0;
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    bVar3 = ActivateBestChain(this,state,pblock);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Chainstate::PreciousBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);
    {
        LOCK(cs_main);
        if (pindex->nChainWork < m_chain.Tip()->nChainWork) {
            // Nothing to do, this block is not at the tip.
            return true;
        }
        if (m_chain.Tip()->nChainWork > m_chainman.nLastPreciousChainwork) {
            // The chain has been extended since the last call, reset the counter.
            m_chainman.nBlockReverseSequenceId = -1;
        }
        m_chainman.nLastPreciousChainwork = m_chain.Tip()->nChainWork;
        setBlockIndexCandidates.erase(pindex);
        pindex->nSequenceId = m_chainman.nBlockReverseSequenceId;
        if (m_chainman.nBlockReverseSequenceId > std::numeric_limits<int32_t>::min()) {
            // We can't keep reducing the counter if somebody really wants to
            // call preciousblock 2**31-1 times on the same set of tips...
            m_chainman.nBlockReverseSequenceId--;
        }
        if (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) && pindex->HaveNumChainTxs()) {
            setBlockIndexCandidates.insert(pindex);
            PruneBlockIndexCandidates();
        }
    }

    return ActivateBestChain(state, std::shared_ptr<const CBlock>());
}